

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

ssize_t ssl_cf_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t len,CURLcode *err)

{
  long *plVar1;
  long lVar2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  long lVar5;
  _Bool done;
  size_t local_38;
  
  plVar1 = (long *)cf->ctx;
  lVar2 = plVar1[9];
  plVar1[9] = (long)data;
  *err = CURLE_OK;
  local_38 = len;
  if ((int)plVar1[0x17] == 1) {
    done = false;
    CVar4 = ssl_cf_connect_deferred(cf,data,(void *)0x0,0,&done);
    *err = CVar4;
    if (CVar4 == CURLE_OK) {
      if (done != false) goto LAB_0016e598;
      *err = CURLE_AGAIN;
    }
    lVar5 = -1;
  }
  else {
LAB_0016e598:
    lVar5 = (**(code **)(*plVar1 + 0xa8))(cf,data,buf,local_38,err);
    if (lVar5 == 0) {
      *err = CURLE_OK;
      lVar5 = 0;
    }
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"cf_recv(len=%zu) -> %zd, %d",local_38,lVar5,(ulong)*err);
  }
  *(long *)((long)cf->ctx + 0x48) = lVar2;
  return lVar5;
}

Assistant:

static ssize_t ssl_cf_recv(struct Curl_cfilter *cf,
                           struct Curl_easy *data, char *buf, size_t len,
                           CURLcode *err)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct cf_call_data save;
  ssize_t nread;

  CF_DATA_SAVE(save, cf, data);
  *err = CURLE_OK;
  if(connssl->state == ssl_connection_deferred) {
    bool done = FALSE;
    *err = ssl_cf_connect_deferred(cf, data, NULL, 0, &done);
    if(*err) {
      nread = -1;
      goto out;
    }
    else if(!done) {
      *err = CURLE_AGAIN;
      nread = -1;
      goto out;
    }
    DEBUGASSERT(connssl->state == ssl_connection_complete);
  }

  nread = connssl->ssl_impl->recv_plain(cf, data, buf, len, err);
  if(nread > 0) {
    DEBUGASSERT((size_t)nread <= len);
  }
  else if(nread == 0) {
    /* eof */
    *err = CURLE_OK;
  }

out:
  CURL_TRC_CF(data, cf, "cf_recv(len=%zu) -> %zd, %d", len,
              nread, *err);
  CF_DATA_RESTORE(cf, save);
  return nread;
}